

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O3

int firstpass(etdc_table **table,uint *input,int size)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  startTimer();
  if (0 < size) {
    uVar2 = 0;
    do {
      etdc_add(table,input[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)size != uVar2);
  }
  startTimer();
  etdc_sort(table);
  startTimer();
  etdc_gencodes(*table);
  times((tms *)&t2);
  dVar3 = (double)((t2.tms_stime + t2.tms_utime) - (t1.tms_utime + t1.tms_stime)) / ticks;
  gettimeofday((timeval *)&tv2,(__timezone_ptr_t)0x0);
  printf("generating = %lf (%ld) \n",dVar3,
         (tv2.tv_usec - tv1.tv_usec) + (tv2.tv_sec - tv1.tv_sec) * 1000000);
  iVar1 = etdc_size(*table);
  return iVar1;
}

Assistant:

int firstpass(struct etdc_table **table, unsigned int *input, int size) {
  int i;

  //adding symbols to hash table

  startTimer();
  for(i = 0; i < size; i++) {
    etdc_add(table, input[i]);
  }
  //printf("add hashtable time = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  //sorting by frequency (high values first)

  startTimer();
  etdc_sort(table);
  //printf("sorting hashtable time = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  //generate codes
  startTimer();
  etdc_gencodes(*table);
  printf("generating = %lf (%ld) \n", timeFromBegin(), realTimeFromBegin());

  return etdc_size(*table);
}